

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  ImVector<ImFontConfig> *this_00;
  char *pcVar1;
  ImFontConfig *pIVar2;
  void *ptr;
  ImFont *pIVar3;
  ImFontConfig *pIVar4;
  int i_1;
  int i;
  long lVar5;
  long lVar6;
  
  this_00 = &this->ConfigData;
  lVar6 = 0;
  for (lVar5 = 0; lVar5 < this_00->Size; lVar5 = lVar5 + 1) {
    pIVar2 = (this->ConfigData).Data;
    ptr = *(void **)(pIVar2->Name + lVar6 + -0x56);
    if ((ptr != (void *)0x0) && (pIVar2->Name[lVar6 + -0x4a] == '\x01')) {
      ImGui::MemFree(ptr);
      pcVar1 = ((this->ConfigData).Data)->Name + lVar6 + -0x56;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
    lVar6 = lVar6 + 0x88;
  }
  for (lVar5 = 0; lVar5 < (this->Fonts).Size; lVar5 = lVar5 + 1) {
    pIVar2 = (this->ConfigData).Data;
    pIVar3 = (this->Fonts).Data[lVar5];
    pIVar4 = pIVar3->ConfigData;
    if ((pIVar2 <= pIVar4) && (pIVar4 < pIVar2 + this_00->Size)) {
      pIVar3->ConfigData = (ImFontConfig *)0x0;
      (this->Fonts).Data[lVar5]->ConfigDataCount = 0;
    }
  }
  ImVector<ImFontConfig>::clear(this_00);
  ImVector<ImFontAtlasCustomRect>::clear(&this->CustomRects);
  this->PackIdMouseCursors = -1;
  this->PackIdLines = -1;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            IM_FREE(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    PackIdMouseCursors = PackIdLines = -1;
    // Important: we leave TexReady untouched
}